

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O1

size_t maxArgWidth(poptOption *opt,char *translation_domain)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  poptOption *opt_00;
  long lVar7;
  mbstate_t local_40;
  char *local_38;
  
  if (opt == (poptOption *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar2 = 0;
    for (; ((pcVar4 = opt->longName, pcVar4 != (char *)0x0 || (opt->shortName != '\0')) ||
           (opt->arg != (void *)0x0)); opt = opt + 1) {
      uVar1 = opt->argInfo;
      if ((_poptArgMask & uVar1) == 4) {
        opt_00 = (poptOption *)opt->arg;
        if ((poptOption *)opt->arg == poptHelpOptions) {
          opt_00 = poptHelpOptionsI18N;
        }
        if (opt_00 != (poptOption *)0x0) {
          uVar2 = maxArgWidth(opt_00,translation_domain);
        }
        if (uVar6 < uVar2) {
          uVar6 = uVar2;
        }
      }
      else if ((uVar1 >> 0x1e & 1) == 0) {
        if (pcVar4 == (char *)0x0) {
          lVar7 = 6;
        }
        else {
          sVar3 = strlen(pcVar4);
          lVar7 = (-1 < (int)uVar1) + sVar3 + 7;
        }
        pcVar4 = getArgDescrip(opt,translation_domain);
        if (pcVar4 != (char *)0x0) {
          pvVar5 = memchr(" =(",(int)*pcVar4,4);
          local_38 = pcVar4;
          sVar3 = strlen(pcVar4);
          local_40.__count = 0;
          local_40.__value = (_union_27)0x0;
          translation_domain = (char *)&local_38;
          sVar3 = mbsrtowcs((wchar_t *)0x0,(char **)translation_domain,sVar3,&local_40);
          lVar7 = lVar7 + sVar3 + (ulong)(pvVar5 == (void *)0x0);
        }
        uVar2 = (ulong)(opt->argInfo >> 0x1b & 2) + lVar7;
        if (uVar6 < uVar2) {
          uVar6 = uVar2;
        }
      }
    }
  }
  return uVar6;
}

Assistant:

static size_t maxArgWidth(const struct poptOption * opt,
		       const char * translation_domain)
{
    size_t max = 0;
    size_t len = 0;
    const char * argDescrip;
    
    if (opt != NULL)
    while (opt->longName || opt->shortName || opt->arg) {
	if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (arg)	/* XXX program error */
		len = maxArgWidth(arg, translation_domain);
	    if (len > max) max = len;
	} else if (!F_ISSET(opt, DOC_HIDDEN)) {
	    len = sizeof("  ")-1;
	    /* XXX --long always padded for alignment with/without "-X, ". */
	    len += sizeof("-X, ")-1;
	    if (opt->longName) {
		len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
		len += strlen(opt->longName);
	    }

	    argDescrip = getArgDescrip(opt, translation_domain);

	    if (argDescrip) {

		/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
		if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

		/* Adjust for (possible) wide characters. */
		len += stringDisplayWidth(argDescrip);
	    }

	    if (F_ISSET(opt, OPTIONAL)) len += sizeof("[]")-1;
	    if (len > max) max = len;
	}
	opt++;
    }
    
    return max;
}